

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

string * __thiscall libDAI::TRW::identify_abi_cxx11_(TRW *this)

{
  InferenceAlgorithm *in_RSI;
  string *in_RDI;
  stringstream result;
  stringstream local_198 [16];
  ostream local_188 [16];
  Properties *in_stack_fffffffffffffe88;
  ostream *in_stack_fffffffffffffe90;
  
  std::__cxx11::stringstream::stringstream(local_198,_S_out);
  std::operator<<(local_188,Name);
  InferenceAlgorithm::GetProperties(in_RSI);
  libDAI::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string TRW::identify() const { 
        stringstream result (stringstream::out);
        result << Name << GetProperties();
        return result.str();
    }